

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

void __thiscall
TadsHttpListenerThread::TadsHttpListenerThread
          (TadsHttpListenerThread *this,vm_obj_id_t srv_obj,TadsMessageQueue *q,long ulim)

{
  OS_Counter *pOVar1;
  
  TadsListenerThread::TadsListenerThread(&this->super_TadsListenerThread,q->quit_evt);
  (this->super_TadsListenerThread).super_OS_Thread.super_CVmWeakRefable.super_CVmRefCntObj.
  _vptr_CVmRefCntObj = (_func_int **)&PTR__TadsHttpListenerThread_00343f20;
  (this->super_TadsListenerThread).super_OS_Thread.super_OS_Waitable._vptr_OS_Waitable =
       (_func_int **)&PTR__TadsHttpListenerThread_00343f58;
  this->srv_obj = srv_obj;
  this->queue = q;
  LOCK();
  pOVar1 = &(q->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  this->upload_limit = ulim;
  return;
}

Assistant:

TadsHttpListenerThread::TadsHttpListenerThread(
    vm_obj_id_t srv_obj, TadsMessageQueue *q, long ulim)
    : TadsListenerThread(q->get_quit_evt())
{
    /* remember the HTTPServer object that created the listener */
    this->srv_obj = srv_obj;

    /* save a reference to the queue */
    (queue = q)->add_ref();

    /* save the upload limit */
    upload_limit = ulim;
}